

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::ParseHierarchyChunk(Discreet3DSImporter *this,uint16_t parent)

{
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *this_00;
  vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_> *this_01;
  StreamReader<false,_false> *this_02;
  int8_t *piVar1;
  Node *this_03;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  char cVar5;
  bool bVar6;
  short sVar7;
  uint _limit;
  uint uVar8;
  uint uVar9;
  Node *pNVar10;
  const_iterator __first;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> __first_00;
  __normal_iterator<Assimp::D3DS::aiFloatKey_*,_std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>_>
  __first_01;
  Logger *pLVar11;
  long lVar12;
  const_iterator __last;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *this_04;
  int32_t iVar13;
  ulong uVar14;
  char *pcVar15;
  ushort uVar16;
  int iVar17;
  bool bVar18;
  float fVar19;
  float angle;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  aiVector3t<float> axis;
  Chunk chunk;
  string name;
  aiQuaterniont<float> local_68;
  float local_58;
  float fStack_54;
  float local_48;
  
  lVar12 = 0x88;
  if ((parent & 0xfffd) == 0xb004) {
    lVar12 = 0xb8;
  }
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&chunk);
    } while ((int)(chunk.Size - 6) < 1);
    this_02 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_02,(chunk.Size - 6) +
                                (*(int *)&this_02->current - *(int *)&this_02->buffer));
    switch(chunk.Flag) {
    case 0xb020:
      StreamReader<false,_false>::IncPtr(this->stream,10);
      uVar8 = StreamReader<false,_false>::Get<int>(this->stream);
      this_04 = (vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                ((long)&this->mCurrentNode->mParent + lVar12);
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(this_04,(ulong)uVar8);
      bVar6 = false;
      while (bVar18 = uVar8 != 0, uVar8 = uVar8 - 1, bVar18) {
        uVar9 = StreamReader<false,_false>::Get<int>(this->stream);
        name.field_2._M_allocated_capacity = name.field_2._M_allocated_capacity & 0xffffffff00000000
        ;
        name._M_string_length = 0;
        name._M_dataplus._M_p = (pointer)(double)uVar9;
        SkipTCBInfo(this);
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        name._M_string_length = CONCAT44(name._M_string_length._4_4_,fVar19);
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        name._M_string_length = CONCAT44(fVar19,(float)name._M_string_length);
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        name.field_2._M_allocated_capacity._0_4_ = fVar19;
        paVar3 = (this_04->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (((this_04->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
             super__Vector_impl_data._M_start != paVar3) &&
           ((double)name._M_dataplus._M_p <= paVar3[-1].mTime)) {
          bVar6 = true;
        }
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                  (this_04,(value_type *)&name);
      }
      if (bVar6) {
        std::
        __stable_sort<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((this_04->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                   (this_04->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
        __first._M_current =
             (aiVectorKey *)
             std::
             __unique<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(aiVectorKey_const&,aiVectorKey_const&)>>
                       ((this_04->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>).
                        _M_impl.super__Vector_impl_data._M_start,
                        (this_04->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>).
                        _M_impl.super__Vector_impl_data._M_finish,
                        (_Iter_comp_iter<bool_(*)(const_aiVectorKey_&,_const_aiVectorKey_&)>)
                        0x3c3d49);
        __last._M_current =
             (this_04->super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>)._M_impl.
             super__Vector_impl_data._M_finish;
LAB_003c297d:
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::erase(this_04,__first,__last);
      }
      break;
    case 0xb021:
      StreamReader<false,_false>::IncPtr(this->stream,10);
      uVar8 = StreamReader<false,_false>::Get<int>(this->stream);
      pNVar10 = this->mCurrentNode;
      this_00 = &pNVar10->aRotationKeys;
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve(this_00,(ulong)uVar8);
      bVar6 = false;
      while (bVar18 = uVar8 != 0, uVar8 = uVar8 - 1, bVar18) {
        uVar9 = StreamReader<false,_false>::Get<int>(this->stream);
        SkipTCBInfo(this);
        name._M_string_length = 0x3f800000;
        name.field_2._M_allocated_capacity = 0;
        name._M_dataplus._M_p = (pointer)(double)uVar9;
        angle = StreamReader<false,_false>::Get<float>(this->stream);
        fVar20 = StreamReader<false,_false>::Get<float>(this->stream);
        fStack_54 = StreamReader<false,_false>::Get<float>(this->stream);
        local_58 = fVar20;
        local_48 = fStack_54;
        fVar21 = StreamReader<false,_false>::Get<float>(this->stream);
        fVar22 = local_58;
        fVar19 = fStack_54;
        if ((fVar21 == 0.0) && (!NAN(fVar21))) {
          fVar19 = 1.0;
          fVar22 = fVar20;
        }
        fVar23 = local_58;
        fVar24 = fStack_54;
        if ((local_48 == 0.0) && (!NAN(local_48))) {
          fVar23 = fVar22;
          fVar24 = fVar19;
        }
        fVar19 = local_58;
        fVar22 = fStack_54;
        if ((fVar20 == 0.0) && (!NAN(fVar20))) {
          fVar19 = fVar23;
          fVar22 = fVar24;
        }
        axis.y = fVar22;
        axis.x = fVar19;
        axis.z = fVar21;
        aiQuaterniont<float>::aiQuaterniont(&local_68,axis,angle);
        name._M_string_length._0_4_ = local_68.w;
        name._M_string_length._4_4_ = local_68.x;
        name.field_2._0_4_ = local_68.y;
        name.field_2._4_4_ = local_68.z;
        paVar4 = (pNVar10->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (((pNVar10->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
             _M_impl.super__Vector_impl_data._M_start != paVar4) &&
           ((double)name._M_dataplus._M_p <= paVar4[-1].mTime)) {
          bVar6 = true;
        }
        std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::push_back(this_00,(value_type *)&name);
      }
      if (bVar6) {
        std::
        __stable_sort<__gnu_cxx::__normal_iterator<aiQuatKey*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((pNVar10->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pNVar10->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        __first_00 = std::
                     __unique<__gnu_cxx::__normal_iterator<aiQuatKey*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(aiQuatKey_const&,aiQuatKey_const&)>>
                               ((pNVar10->aRotationKeys).
                                super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (pNVar10->aRotationKeys).
                                super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                                super__Vector_impl_data._M_finish,
                                (_Iter_comp_iter<bool_(*)(const_aiQuatKey_&,_const_aiQuatKey_&)>)
                                0x3c3f1d);
        std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::erase
                  (this_00,(const_iterator)__first_00._M_current,
                   (pNVar10->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      break;
    case 0xb022:
      StreamReader<false,_false>::IncPtr(this->stream,10);
      sVar7 = StreamReader<false,_false>::Get<short>(this->stream);
      uVar14 = (ulong)(uint)(int)sVar7;
      StreamReader<false,_false>::IncPtr(this->stream,2);
      pNVar10 = this->mCurrentNode;
      this_04 = &pNVar10->aScalingKeys;
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(this_04,uVar14);
      bVar6 = false;
      while (iVar17 = (int)uVar14, uVar14 = (ulong)(iVar17 - 1), iVar17 != 0) {
        uVar8 = StreamReader<false,_false>::Get<int>(this->stream);
        SkipTCBInfo(this);
        name.field_2._M_allocated_capacity = name.field_2._M_allocated_capacity & 0xffffffff00000000
        ;
        name._M_string_length = 0;
        name._M_dataplus._M_p = (pointer)(double)uVar8;
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        name._M_string_length = CONCAT44(name._M_string_length._4_4_,fVar19);
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        name._M_string_length = CONCAT44(fVar19,(float)name._M_string_length);
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        name.field_2._M_allocated_capacity._0_4_ = fVar19;
        paVar3 = (pNVar10->aScalingKeys).
                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (((pNVar10->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
             _M_impl.super__Vector_impl_data._M_start != paVar3) &&
           ((double)name._M_dataplus._M_p <= paVar3[-1].mTime)) {
          bVar6 = true;
        }
        if (((float)name._M_string_length == 0.0) && (!NAN((float)name._M_string_length))) {
          name._M_string_length = CONCAT44(name._M_string_length._4_4_,0x3f800000);
        }
        if ((name._M_string_length._4_4_ == 0.0) && (!NAN(name._M_string_length._4_4_))) {
          name._M_string_length = CONCAT44(0x3f800000,(float)name._M_string_length);
        }
        if ((fVar19 == 0.0) && (!NAN(fVar19))) {
          name.field_2._M_allocated_capacity._0_4_ = 0x3f800000;
        }
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                  (this_04,(value_type *)&name);
      }
      if (bVar6) {
        std::
        __stable_sort<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((pNVar10->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pNVar10->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        __first._M_current =
             (aiVectorKey *)
             std::
             __unique<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(aiVectorKey_const&,aiVectorKey_const&)>>
                       ((pNVar10->aScalingKeys).
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (pNVar10->aScalingKeys).
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_finish,
                        (_Iter_comp_iter<bool_(*)(const_aiVectorKey_&,_const_aiVectorKey_&)>)
                        0x3c3d49);
        __last._M_current =
             (pNVar10->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_003c297d;
      }
      break;
    case 0xb023:
      pLVar11 = DefaultLogger::get();
      Logger::error(pLVar11,"3DS: Skipping FOV animation track. This is not supported");
      break;
    case 0xb024:
      if (parent == 0xb003) {
        pNVar10 = this->mCurrentNode;
        this_01 = &pNVar10->aCameraRollKeys;
        StreamReader<false,_false>::IncPtr(this->stream,10);
        uVar8 = StreamReader<false,_false>::Get<int>(this->stream);
        std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::reserve
                  (this_01,(ulong)uVar8);
        bVar6 = false;
        while (bVar18 = uVar8 != 0, uVar8 = uVar8 - 1, bVar18) {
          uVar9 = StreamReader<false,_false>::Get<int>(this->stream);
          name._M_dataplus._M_p = (pointer)(double)uVar9;
          SkipTCBInfo(this);
          fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
          name._M_string_length = CONCAT44(name._M_string_length._4_4_,fVar19);
          paVar2 = (pNVar10->aCameraRollKeys).
                   super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((pNVar10->aCameraRollKeys).
               super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
               ._M_impl.super__Vector_impl_data._M_start != paVar2) &&
             ((double)name._M_dataplus._M_p <= paVar2[-1].mTime)) {
            bVar6 = true;
          }
          std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
          push_back(this_01,(value_type *)&name);
        }
        if (bVar6) {
          std::
          __stable_sort<__gnu_cxx::__normal_iterator<Assimp::D3DS::aiFloatKey*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((pNVar10->aCameraRollKeys).
                     super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pNVar10->aCameraRollKeys).
                     super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          __first_01 = std::
                       __unique<__gnu_cxx::__normal_iterator<Assimp::D3DS::aiFloatKey*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Assimp::D3DS::aiFloatKey_const&,Assimp::D3DS::aiFloatKey_const&)>>
                                 ((pNVar10->aCameraRollKeys).
                                  super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pNVar10->aCameraRollKeys).
                                  super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  (_Iter_comp_iter<bool_(*)(const_Assimp::D3DS::aiFloatKey_&,_const_Assimp::D3DS::aiFloatKey_&)>
                                   )0x3c3e19);
          std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::erase
                    (this_01,(const_iterator)__first_01._M_current,
                     (pNVar10->aCameraRollKeys).
                     super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      else {
        pLVar11 = DefaultLogger::get();
        pcVar15 = "3DS: Ignoring roll track for non-camera object";
LAB_003c2a47:
        Logger::warn(pLVar11,pcVar15);
      }
      break;
    default:
      if (chunk.Flag == 0xb013) {
        if (parent != 0xb002) {
          pLVar11 = DefaultLogger::get();
          pcVar15 = "3DS: Skipping pivot subchunk for non usual object";
          goto LAB_003c2a47;
        }
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).x = fVar19;
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).y = fVar19;
        fVar19 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).z = fVar19;
      }
      else {
        if (chunk.Flag == 0xb011) {
          pcVar15 = this->stream->current;
          do {
            cVar5 = StreamReader<false,_false>::Get<signed_char>(this->stream);
          } while (cVar5 != '\0');
          bVar6 = std::operator==(&this->mCurrentNode->mName,"$$$DUMMY");
          if (!bVar6) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name,pcVar15,(allocator<char> *)&local_68);
          std::__cxx11::string::operator=((string *)&this->mCurrentNode->mName,(string *)&name);
        }
        else {
          if (chunk.Flag != 0xb010) break;
          piVar1 = this->stream->current;
          uVar14 = 0xffffffffffffffff;
          do {
            cVar5 = StreamReader<false,_false>::Get<signed_char>(this->stream);
            uVar14 = (ulong)((int)uVar14 + 1);
          } while (cVar5 != '\0');
          name._M_dataplus._M_p = (pointer)&name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&name,piVar1,piVar1 + uVar14);
          pNVar10 = FindNode(this->mRootNode,&name);
          iVar13 = 1;
          if (pNVar10 == (Node *)0x0) {
LAB_003c248d:
            pNVar10 = (Node *)operator_new(0xf8);
            D3DS::Node::Node(pNVar10,&name);
            pNVar10->mInstanceNumber = iVar13;
            StreamReader<false,_false>::IncPtr(this->stream,4);
            sVar7 = StreamReader<false,_false>::Get<short>(this->stream);
            uVar16 = sVar7 + 1;
            pNVar10->mHierarchyPos = uVar16;
            sVar7 = this->mLastNodeIndex;
            pNVar10->mHierarchyIndex = sVar7;
            this_03 = this->mCurrentNode;
            if ((this_03 == (Node *)0x0) || ((int)this_03->mHierarchyPos != (uint)uVar16)) {
              if ((int)(uint)uVar16 < (int)sVar7) {
                InverseNodeSearch(this,pNVar10,this_03);
                goto LAB_003c2a5d;
              }
              D3DS::Node::push_back(this_03,pNVar10);
            }
            else {
              D3DS::Node::push_back(this_03->mParent,pNVar10);
LAB_003c2a5d:
              uVar16 = (short)*(undefined4 *)&this->mLastNodeIndex + 1;
            }
            this->mLastNodeIndex = uVar16;
          }
          else if (parent == 0xb002) {
            iVar13 = pNVar10->mInstanceCount + 1;
            pNVar10->mInstanceCount = iVar13;
            goto LAB_003c248d;
          }
          this->mCurrentNode = pNVar10;
        }
        std::__cxx11::string::~string((string *)&name);
      }
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
    if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseHierarchyChunk(uint16_t parent)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_TRACKOBJNAME:

        // This is the name of the object to which the track applies. The chunk also
        // defines the position of this object in the hierarchy.
        {

        // First of all: get the name of the object
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();

        while (stream->GetI1())++cnt;
        std::string name = std::string(sz,cnt);

        // Now find out whether we have this node already (target animation channels
        // are stored with a separate object ID)
        D3DS::Node* pcNode = FindNode(mRootNode,name);
        int instanceNumber = 1;

        if ( pcNode)
        {
            // if the source is not a CHUNK_TRACKINFO block it won't be an object instance
            if (parent != Discreet3DS::CHUNK_TRACKINFO)
            {
                mCurrentNode = pcNode;
                break;
            }
            pcNode->mInstanceCount++;
            instanceNumber = pcNode->mInstanceCount;
        }
        pcNode = new D3DS::Node(name);
        pcNode->mInstanceNumber = instanceNumber;

        // There are two unknown values which we can safely ignore
        stream->IncPtr(4);

        // Now read the hierarchy position of the object
        uint16_t hierarchy = stream->GetI2() + 1;
        pcNode->mHierarchyPos   = hierarchy;
        pcNode->mHierarchyIndex = mLastNodeIndex;

        // And find a proper position in the graph for it
        if (mCurrentNode && mCurrentNode->mHierarchyPos == hierarchy)   {

            // add to the parent of the last touched node
            mCurrentNode->mParent->push_back(pcNode);
            mLastNodeIndex++;
        }
        else if(hierarchy >= mLastNodeIndex)    {

            // place it at the current position in the hierarchy
            mCurrentNode->push_back(pcNode);
            mLastNodeIndex = hierarchy;
        }
        else    {
            // need to go back to the specified position in the hierarchy.
            InverseNodeSearch(pcNode,mCurrentNode);
            mLastNodeIndex++;
        }
        // Make this node the current node
        mCurrentNode = pcNode;
        }
        break;

    case Discreet3DS::CHUNK_TRACKDUMMYOBJNAME:

        // This is the "real" name of a $$$DUMMY object
        {
            const char* sz = (const char*) stream->GetPtr();
            while (stream->GetI1());

            // If object name is DUMMY, take this one instead
            if (mCurrentNode->mName == "$$$DUMMY")  {
                mCurrentNode->mName = std::string(sz);
                break;
            }
        }
        break;

    case Discreet3DS::CHUNK_TRACKPIVOT:

        if ( Discreet3DS::CHUNK_TRACKINFO != parent)
        {
            ASSIMP_LOG_WARN("3DS: Skipping pivot subchunk for non usual object");
            break;
        }

        // Pivot = origin of rotation and scaling
        mCurrentNode->vPivot.x = stream->GetF4();
        mCurrentNode->vPivot.y = stream->GetF4();
        mCurrentNode->vPivot.z = stream->GetF4();
        break;


        // ////////////////////////////////////////////////////////////////////
        // POSITION KEYFRAME
    case Discreet3DS::CHUNK_TRACKPOS:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();
        bool sortKeys = false;

        // This could also be meant as the target position for
        // (targeted) lights and cameras
        std::vector<aiVectorKey>* l;
        if ( Discreet3DS::CHUNK_TRACKCAMTGT == parent || Discreet3DS::CHUNK_TRACKLIGTGT == parent)  {
            l = & mCurrentNode->aTargetPositionKeys;
        }
        else l = & mCurrentNode->aPositionKeys;

        l->reserve(numFrames);
        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();

            // Setup a new position key
            aiVectorKey v;
            v.mTime = (double)fidx;

            SkipTCBInfo();
            v.mValue.x = stream->GetF4();
            v.mValue.y = stream->GetF4();
            v.mValue.z = stream->GetF4();

            // check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Add the new keyframe to the list
            l->push_back(v);
        }

        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiVectorKey>), l->end() );
        }}

        break;

        // ////////////////////////////////////////////////////////////////////
        // CAMERA ROLL KEYFRAME
    case Discreet3DS::CHUNK_TRACKROLL:
        {
        // roll keys are accepted for cameras only
        if (parent != Discreet3DS::CHUNK_TRACKCAMERA)   {
            ASSIMP_LOG_WARN("3DS: Ignoring roll track for non-camera object");
            break;
        }
        bool sortKeys = false;
        std::vector<aiFloatKey>* l = &mCurrentNode->aCameraRollKeys;

        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();
        l->reserve(numFrames);
        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();

            // Setup a new position key
            aiFloatKey v;
            v.mTime = (double)fidx;

            // This is just a single float
            SkipTCBInfo();
            v.mValue = stream->GetF4();

            // Check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Add the new keyframe to the list
            l->push_back(v);
        }

        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiFloatKey>), l->end() );
        }}
        break;


        // ////////////////////////////////////////////////////////////////////
        // CAMERA FOV KEYFRAME
    case Discreet3DS::CHUNK_TRACKFOV:
        {
            ASSIMP_LOG_ERROR("3DS: Skipping FOV animation track. "
                "This is not supported");
        }
        break;


        // ////////////////////////////////////////////////////////////////////
        // ROTATION KEYFRAME
    case Discreet3DS::CHUNK_TRACKROTATE:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();

        bool sortKeys = false;
        std::vector<aiQuatKey>* l = &mCurrentNode->aRotationKeys;
        l->reserve(numFrames);

        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();
            SkipTCBInfo();

            aiQuatKey v;
            v.mTime = (double)fidx;

            // The rotation keyframe is given as an axis-angle pair
            const float rad = stream->GetF4();
            aiVector3D axis;
            axis.x = stream->GetF4();
            axis.y = stream->GetF4();
            axis.z = stream->GetF4();

            if (!axis.x && !axis.y && !axis.z)
                axis.y = 1.f;

            // Construct a rotation quaternion from the axis-angle pair
            v.mValue = aiQuaternion(axis,rad);

            // Check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // add the new keyframe to the list
            l->push_back(v);
        }
        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiQuatKey>), l->end() );
        }}
        break;

        // ////////////////////////////////////////////////////////////////////
        // SCALING KEYFRAME
    case Discreet3DS::CHUNK_TRACKSCALE:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI2();
        stream->IncPtr(2);

        bool sortKeys = false;
        std::vector<aiVectorKey>* l = &mCurrentNode->aScalingKeys;
        l->reserve(numFrames);

        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();
            SkipTCBInfo();

            // Setup a new key
            aiVectorKey v;
            v.mTime = (double)fidx;

            // ... and read its value
            v.mValue.x = stream->GetF4();
            v.mValue.y = stream->GetF4();
            v.mValue.z = stream->GetF4();

            // check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Remove zero-scalings on singular axes - they've been reported to be there erroneously in some strange files
            if (!v.mValue.x) v.mValue.x = 1.f;
            if (!v.mValue.y) v.mValue.y = 1.f;
            if (!v.mValue.z) v.mValue.z = 1.f;

            l->push_back(v);
        }
        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiVectorKey>), l->end() );
        }}
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}